

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O0

int crypto_import_certificate
              (CK_SESSION_HANDLE hSession,char *filePath,char *label,char *objID,size_t objIDLen)

{
  X509_NAME *pXVar1;
  ASN1_INTEGER *pAVar2;
  CK_RV CVar3;
  undefined8 in_RCX;
  char *in_RDX;
  char *in_RSI;
  CK_SESSION_HANDLE in_RDI;
  undefined8 in_R8;
  CK_RV rv;
  CK_OBJECT_HANDLE hCert;
  CK_ATTRIBUTE certTemplate [10];
  CK_BBOOL ckTrue;
  CK_BBOOL ckFalse;
  CK_CERTIFICATE_TYPE certType;
  CK_OBJECT_CLASS certClass;
  int ret;
  int serialSize;
  int issuerSize;
  int subjectSize;
  int blobSize;
  CK_BYTE_PTR p;
  CK_BYTE_PTR serial;
  CK_BYTE_PTR issuer;
  CK_BYTE_PTR subject;
  CK_BYTE_PTR blob;
  X509 *x509;
  BIO *in;
  CK_OBJECT_HANDLE local_190;
  _CK_ATTRIBUTE local_188;
  undefined8 local_170;
  undefined8 *local_168;
  undefined8 local_160;
  undefined8 local_158;
  char *local_150;
  size_t local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined1 *local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined1 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  uchar *local_f0;
  long local_e8;
  undefined8 local_e0;
  uchar *local_d8;
  long local_d0;
  undefined8 local_c8;
  uchar *local_c0;
  long local_b8;
  undefined8 local_b0;
  uchar *local_a8;
  long local_a0;
  undefined1 local_8a;
  undefined1 local_89;
  undefined8 local_88;
  undefined8 local_80;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  uchar *local_60;
  uchar *local_58;
  uchar *local_50;
  uchar *local_48;
  uchar *local_40;
  X509 *local_38;
  BIO *local_30;
  undefined8 local_28;
  undefined8 local_20;
  char *local_18;
  char *local_10;
  CK_SESSION_HANDLE local_8;
  
  local_30 = (BIO *)0x0;
  local_38 = (X509 *)0x0;
  local_40 = (uchar *)0x0;
  local_48 = (uchar *)0x0;
  local_50 = (uchar *)0x0;
  local_58 = (uchar *)0x0;
  local_74 = 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = BIO_new_file(in_RSI,"rb");
  if (local_30 == (BIO *)0x0) {
    fprintf(_stderr,"ERROR: Could open the PKCS#8 file: %s\n",local_10);
  }
  else {
    local_38 = PEM_read_bio_X509(local_30,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (local_38 == (X509 *)0x0) {
      fprintf(_stderr,"ERROR: Could not read the certificate file: %s\n",local_10);
    }
    else {
      local_64 = i2d_X509(local_38,(uchar **)0x0);
      pXVar1 = X509_get_subject_name(local_38);
      local_68 = i2d_X509_NAME(pXVar1,(uchar **)0x0);
      pXVar1 = X509_get_issuer_name(local_38);
      local_6c = i2d_X509_NAME(pXVar1,(uchar **)0x0);
      pAVar2 = X509_get_serialNumber(local_38);
      local_70 = i2d_ASN1_INTEGER(pAVar2,(uchar **)0x0);
      if ((((local_64 < 0) || (local_68 < 0)) || (local_6c < 0)) || (local_70 < 0)) {
        fprintf(_stderr,"ERROR: Could not convert certificate to DER.\n");
      }
      else {
        if (0 < local_64) {
          local_40 = (uchar *)malloc((long)local_64);
          if (local_40 == (uchar *)0x0) {
            fprintf(_stderr,"ERROR: Could not allocate memory.\n");
            goto LAB_0011a328;
          }
          local_60 = local_40;
          local_64 = i2d_X509(local_38,&local_60);
        }
        if (0 < local_68) {
          local_48 = (uchar *)malloc((long)local_68);
          if (local_48 == (uchar *)0x0) {
            fprintf(_stderr,"ERROR: Could not allocate memory.\n");
            goto LAB_0011a328;
          }
          local_60 = local_48;
          pXVar1 = X509_get_subject_name(local_38);
          local_68 = i2d_X509_NAME(pXVar1,&local_60);
        }
        if (0 < local_6c) {
          local_50 = (uchar *)malloc((long)local_6c);
          if (local_50 == (uchar *)0x0) {
            fprintf(_stderr,"ERROR: Could not allocate memory.\n");
            goto LAB_0011a328;
          }
          local_60 = local_50;
          pXVar1 = X509_get_issuer_name(local_38);
          local_6c = i2d_X509_NAME(pXVar1,&local_60);
        }
        if (0 < local_70) {
          local_58 = (uchar *)malloc((long)local_70);
          if (local_58 == (uchar *)0x0) {
            fprintf(_stderr,"ERROR: Could not allocate memory.\n");
            goto LAB_0011a328;
          }
          local_60 = local_58;
          pAVar2 = X509_get_serialNumber(local_38);
          local_70 = i2d_ASN1_INTEGER(pAVar2,&local_60);
        }
        if (((local_64 < 0) || (local_68 < 0)) || ((local_6c < 0 || (local_70 < 0)))) {
          fprintf(_stderr,"ERROR: Could not convert certificate to DER.\n");
        }
        else {
          local_80 = 1;
          local_88 = 0;
          local_89 = 0;
          local_8a = 1;
          local_188.type = 0;
          local_188.pValue = &local_80;
          local_188.ulValueLen = 8;
          local_170 = 0x80;
          local_168 = &local_88;
          local_160 = 8;
          local_158 = 3;
          local_150 = local_18;
          local_148 = strlen(local_18);
          local_140 = 0x102;
          local_138 = local_20;
          local_130 = local_28;
          local_128 = 1;
          local_120 = &local_8a;
          local_118 = 1;
          local_110 = 2;
          local_108 = &local_89;
          local_100 = 1;
          local_f8 = 0x11;
          local_f0 = local_40;
          local_e8 = (long)local_64;
          local_e0 = 0x101;
          local_d8 = local_48;
          local_d0 = (long)local_68;
          local_c8 = 0x81;
          local_c0 = local_50;
          local_b8 = (long)local_6c;
          local_b0 = 0x82;
          local_a8 = local_58;
          local_a0 = (long)local_70;
          CVar3 = (*p11->C_CreateObject)(local_8,&local_188,10,&local_190);
          if (CVar3 == 0) {
            printf("The certificate has been imported.\n");
            local_74 = 0;
          }
          else {
            fprintf(_stderr,"ERROR: Could not save the certificate in the token.\n");
          }
        }
      }
    }
  }
LAB_0011a328:
  free(local_40);
  free(local_48);
  free(local_50);
  free(local_58);
  X509_free(local_38);
  BIO_free(local_30);
  return local_74;
}

Assistant:

int crypto_import_certificate
(
	CK_SESSION_HANDLE hSession,
	char* filePath,
	char* label,
	char* objID,
	size_t objIDLen
)
{
	BIO* in = NULL;
	X509* x509 = NULL;
	CK_BYTE_PTR blob = NULL;
	CK_BYTE_PTR subject = NULL;
	CK_BYTE_PTR issuer = NULL;
	CK_BYTE_PTR serial = NULL;
	CK_BYTE_PTR p;
	int blobSize;
	int subjectSize;
	int issuerSize;
	int serialSize;
	int ret = 1;

	if (!(in = BIO_new_file(filePath, "rb")))
	{
		fprintf(stderr, "ERROR: Could open the PKCS#8 file: %s\n", filePath);
		goto cleanup;
	}

	if ((x509 = PEM_read_bio_X509(in, NULL, NULL, NULL)) == NULL)
	{
		fprintf(stderr, "ERROR: Could not read the certificate file: %s\n", filePath);
		goto cleanup;
	}

	blobSize = i2d_X509(x509, NULL);
	subjectSize = i2d_X509_NAME(X509_get_subject_name(x509), NULL);
	issuerSize = i2d_X509_NAME(X509_get_issuer_name(x509), NULL);
	serialSize = i2d_ASN1_INTEGER(X509_get_serialNumber(x509), NULL);

	if
	(
		blobSize < 0 ||
		subjectSize < 0 ||
		issuerSize < 0 ||
		serialSize < 0
	)
	{
		fprintf(stderr, "ERROR: Could not convert certificate to DER.\n");
		goto cleanup;
	}

	if (blobSize > 0)
	{
		if ((blob = (CK_BYTE_PTR)malloc(blobSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = blob;
		blobSize = i2d_X509(x509, &p);
	}
	if (subjectSize > 0) {
		if ((subject = (CK_BYTE_PTR)malloc(subjectSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = subject;
		subjectSize = i2d_X509_NAME(X509_get_subject_name(x509), &p);
	}
	if (issuerSize > 0)
	{
		if ((issuer = (CK_BYTE_PTR)malloc(issuerSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = issuer;
		issuerSize = i2d_X509_NAME(X509_get_issuer_name(x509), &p);
	}
	if (serialSize > 0)
	{
		if ((serial = (CK_BYTE_PTR)malloc(serialSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = serial;
		serialSize = i2d_ASN1_INTEGER(X509_get_serialNumber(x509), &p);
	}

	if
	(
		blobSize < 0 ||
		subjectSize < 0 ||
		issuerSize < 0 ||
		serialSize < 0
	)
	{
		fprintf(stderr, "ERROR: Could not convert certificate to DER.\n");
		goto cleanup;
	}

	{
		CK_OBJECT_CLASS certClass = CKO_CERTIFICATE;
		CK_CERTIFICATE_TYPE certType = CKC_X_509;
		CK_BBOOL ckFalse = CK_FALSE, ckTrue = CK_TRUE;
		CK_ATTRIBUTE certTemplate[] = {
			{ CKA_CLASS,            &certClass,   sizeof(certClass) },
			{ CKA_CERTIFICATE_TYPE, &certType,    sizeof(certType) },
			{ CKA_LABEL,            label,        strlen(label) },
			{ CKA_ID,               objID,        objIDLen },
			{ CKA_TOKEN,            &ckTrue,      sizeof(ckTrue) },
			{ CKA_PRIVATE,          &ckFalse,     sizeof(ckFalse) },
			{ CKA_VALUE,            blob,         (CK_ULONG)blobSize },
			{ CKA_SUBJECT,          subject,      (CK_ULONG)subjectSize },
			{ CKA_ISSUER,           issuer,       (CK_ULONG)issuerSize },
			{ CKA_SERIAL_NUMBER,    serial,       (CK_ULONG)serialSize }
		};

		CK_OBJECT_HANDLE hCert;
		CK_RV rv = p11->C_CreateObject(hSession, certTemplate, 10, &hCert);
		if (rv != CKR_OK)
		{
			fprintf(stderr, "ERROR: Could not save the certificate in the token.\n");
			goto cleanup;
		}
	}

	printf("The certificate has been imported.\n");

	ret = 0;

cleanup:

	free(blob);
	free(subject);
	free(issuer);
	free(serial);
	X509_free(x509);
	BIO_free(in);

	return ret;
}